

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * __thiscall
gmlc::utilities::stringOps::getTailString_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,char sep)

{
  size_type sVar1;
  allocator<char> local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  string_view input_local;
  
  input_local._M_str = (char *)input._M_len;
  input_local._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&input_local,(char)input._M_str,0xffffffffffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    local_28._M_str = input_local._M_str;
    local_28._M_len = input_local._M_len;
  }
  else {
    local_28 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,sVar1 + 1
                          ,0xffffffffffffffff);
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_28,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string getTailString(std::string_view input, char sep) noexcept
    {
        auto sepLoc = input.find_last_of(sep);
        auto ret = std::string(
            (sepLoc == std::string::npos) ? input : input.substr(sepLoc + 1));
        return ret;
    }